

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

TRef lj_opt_cse(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  IRIns *pIVar4;
  IRRef2 IVar5;
  byte bVar6;
  ushort uVar7;
  IRRef1 *pIVar8;
  ulong uVar9;
  
  uVar7 = (J->fold).ins.field_0.op1;
  uVar1 = (J->fold).ins.field_0.op2;
  IVar5 = (J->fold).ins.field_1.op12;
  bVar6 = (J->fold).ins.field_1.o;
  if ((J->flags & 0x20000) != 0) {
    pIVar8 = J->chain + bVar6;
    if (uVar7 < uVar1) {
      uVar7 = uVar1;
    }
    while( true ) {
      uVar1 = *pIVar8;
      if (uVar1 <= uVar7) break;
      pIVar4 = (J->cur).ir + uVar1;
      if ((pIVar4->field_1).op12 == IVar5) {
        iVar3._0_2_ = *(IROpT *)((long)pIVar4 + 4);
        iVar3._2_2_ = *(IRRef1 *)((long)pIVar4 + 6);
        return iVar3 << 0x18 | (uint)uVar1;
      }
      pIVar8 = &(pIVar4->field_0).prev;
    }
  }
  uVar2 = (J->cur).nins;
  uVar9 = (ulong)uVar2;
  if (J->irtoplim <= uVar2) {
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar2 + 1;
  pIVar4 = (J->cur).ir;
  *(IRRef1 *)((long)pIVar4 + uVar9 * 8 + 6) = J->chain[bVar6];
  pIVar4[uVar9].field_1.op12 = IVar5;
  J->chain[bVar6] = (IRRef1)uVar2;
  *(IROp1 *)((long)pIVar4 + uVar9 * 8 + 5) = (J->fold).ins.field_1.o;
  iVar3 = *(int *)((long)&(J->fold).ins + 4);
  bVar6 = (byte)iVar3;
  (J->guardemit).irt = (J->guardemit).irt | bVar6;
  *(byte *)((long)pIVar4 + uVar9 * 8 + 4) = bVar6;
  return iVar3 * 0x1000000 + uVar2;
}

Assistant:

TRef LJ_FASTCALL lj_opt_cse(jit_State *J)
{
  /* Avoid narrow to wide store-to-load forwarding stall */
  IRRef2 op12 = (IRRef2)fins->op1 + ((IRRef2)fins->op2 << 16);
  IROp op = fins->o;
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    /* Limited search for same operands in per-opcode chain. */
    IRRef ref = J->chain[op];
    IRRef lim = fins->op1;
    if (fins->op2 > lim) lim = fins->op2;  /* Relies on lit < REF_BIAS. */
    while (ref > lim) {
      if (IR(ref)->op12 == op12)
	return TREF(ref, irt_t(IR(ref)->t));  /* Common subexpression found. */
      ref = IR(ref)->prev;
    }
  }
  /* Otherwise emit IR (inlined for speed). */
  {
    IRRef ref = lj_ir_nextins(J);
    IRIns *ir = IR(ref);
    ir->prev = J->chain[op];
    ir->op12 = op12;
    J->chain[op] = (IRRef1)ref;
    ir->o = fins->o;
    J->guardemit.irt |= fins->t.irt;
    return TREF(ref, irt_t((ir->t = fins->t)));
  }
}